

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_labeltype.cxx
# Opt level: O3

void fl_normal_label(Fl_Label *o,int X,int Y,int W,int H,Fl_Align align)

{
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)o->font,(ulong)(uint)o->size);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)o->color)
  ;
  fl_draw(o->value,X,Y,W,H,align,o->image,1);
  return;
}

Assistant:

void
fl_normal_label(const Fl_Label* o, int X, int Y, int W, int H, Fl_Align align)
{
  fl_font(o->font, o->size);
  fl_color((Fl_Color)o->color);
  fl_draw(o->value, X, Y, W, H, align, o->image);
}